

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O0

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::add
          (AbstractingUnifier *au,
          FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          *s1,FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *s2)

{
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *r;
  DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *l;
  anon_class_1_0_00000001 *this_00;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RDI;
  anon_class_1_0_00000001 mergeSet;
  anon_class_1_0_00000001 mergeArray;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *in_stack_000000a0;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_> *in_stack_000000a8;
  anon_class_1_0_00000001 *in_stack_000000b0;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_stack_ffffffffffffff68;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffa0;
  
  this = (FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          *)Lib::
            Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x9f6748);
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f6757);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f6777);
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f678a);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f67aa);
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f67bd);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f67dd);
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f67f0);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  r = Lib::
      Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)0x9f6810);
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f6823);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#1}::operator()(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  l = Lib::
      Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::operator*((Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)0x9f6843);
  Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f6856);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#2}::operator()
            (in_stack_ffffffffffffffa0,l,
             (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)r);
  this_00 = (anon_class_1_0_00000001 *)
            Lib::
            Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            ::operator*((Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x9f6876);
  Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f6889);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#2}::operator()
            (this_00,l,(DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)r);
  Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f68a9);
  Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f68bc);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#2}::operator()
            (this_00,l,(DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)r);
  Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f68df);
  Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9f68f5);
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::
  add(Kernel::AbstractingUnifier&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>)
  ::{lambda(auto:1&,auto:2&)#2}::operator()
            (this_00,l,(DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)r);
  FloorUwaState(this,in_stack_ffffffffffffff68);
  return in_RDI;
}

Assistant:

static FloorUwaState add(AbstractingUnifier& au, FloorUwaState s1, FloorUwaState s2) {
    auto mergeArray = [](auto& l, auto& r) {
      auto compare = [](auto& l, auto& r) { return TermSpec::compare(l.first, r.first,
          [](auto& t) -> auto& { return t; }); };
      //  ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^
      // TODO create option for "deep" compare using a differnt deref clsoure
      l.sort([&](auto& l, auto& r) { return compare(l, r) < 0; });
      r.sort([&](auto& l, auto& r) { return compare(l, r) < 0; });
      size_t li = 0;
      size_t ri = 0;
      size_t lEnd = l.size();
      size_t rEnd = r.size();
      while (li < lEnd && ri < rEnd) {
        auto cmp = compare(l[li], r[ri]);
        if (cmp == 0) {
          l[li].second += r[ri].second;
          ri++;
        } else if (cmp > 0) {
          l.push(r[ri++]);
        } else {
          li++;
        }
      }
      if (li == lEnd) {
        while (ri < rEnd) {
          l.push(r[ri++]);
        }
      }
      size_t read = 0;
      size_t write = 0;
      while (read < l.size()) {
        if (l[read].second == 0) {
          read++;
        } else {
          l[write++] = l[read++];
        }
      }
      l.pop(l.size() - write);
    };
    mergeArray(*s1.ratVars, *s2.ratVars);
    mergeArray(*s1.intVars, *s2.intVars);
    mergeArray(*s1.mixVars, *s2.mixVars);
    mergeArray(*s1.ratAtoms, *s2.ratAtoms);
    mergeArray(*s1.intAtoms, *s2.intAtoms);
    auto mergeSet = [](auto& l, auto& r) { l.loadFromIterator(r.iterator()); };
    mergeSet(*s1.ratVarSet, *s2.ratVarSet);
    mergeSet(*s1.mixVarSet, *s2.mixVarSet);
    mergeSet(*s1.intVarSet, *s2.intVarSet);
    mergeSet(*s1.shieldedVars, *s2.shieldedVars);
    return s1;
  }